

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

int __thiscall
QGraphicsLinearLayout::stretchFactor(QGraphicsLinearLayout *this,QGraphicsLayoutItem *item)

{
  QGraphicsLinearLayoutPrivate *this_00;
  long in_RSI;
  long in_FS_OFFSET;
  QGraphicsLinearLayoutPrivate *d;
  undefined4 in_stack_ffffffffffffffa8;
  Orientation in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_2c;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsLinearLayout *)0x9b778a);
  if (in_RSI == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)0x0,(char *)this_00,in_stack_ffffffffffffffb4,
               (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QMessageLogger::warning
              (local_28,
               "QGraphicsLinearLayout::setStretchFactor: cannot return a stretch factor for a null item"
              );
    local_2c = 0;
  }
  else {
    local_2c = QGraphicsGridLayoutEngine::stretchFactor
                         ((QGraphicsGridLayoutEngine *)this_00,
                          (QGraphicsLayoutItem *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_2c;
  }
  __stack_chk_fail();
}

Assistant:

int QGraphicsLinearLayout::stretchFactor(QGraphicsLayoutItem *item) const
{
    Q_D(const QGraphicsLinearLayout);
    if (!item) {
        qWarning("QGraphicsLinearLayout::setStretchFactor: cannot return"
                 " a stretch factor for a null item");
        return 0;
    }
    return d->engine.stretchFactor(item, d->orientation);
}